

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::OccluderStaticFragDepthCostCase::genOccluderGeometry
          (ObjectData *__return_storage_ptr__,OccluderStaticFragDepthCostCase *this)

{
  size_type sVar1;
  pointer __dest;
  float depth;
  size_type __dnew;
  string local_50;
  size_type local_30;
  
  local_30 = 0x125;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_30);
  sVar1 = local_30;
  local_50.field_2._M_allocated_capacity = local_30;
  local_50._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "#version 300 es\nin mediump vec3 v_bcoords;\nout mediump vec4 fragColor;\nvoid main()\n{\n\tmediump float d = gl_FragCoord.z;\n\tgl_FragDepth = gl_FragCoord.z + 0.1;\n\tif (v_bcoords.x < 0.02 || v_bcoords.y < 0.02 || v_bcoords.z < 0.02)\n\t\tfragColor = vec4(d,1,d,1);\n\telse\n\t\tfragColor = vec4(0,d,0,1);\n}\n"
         ,0x125);
  local_50._M_string_length = sVar1;
  __dest[sVar1] = '\0';
  Utils::quadWith(__return_storage_ptr__,&local_50,depth);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccluderGeometry					(void) const { return Utils::quadWith(Utils::getStaticFragDepthFragmentShader(), 0.2f); }